

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O0

void __thiscall
fizplex::ColMatrix_AssignmentOperator_Test::TestBody(ColMatrix_AssignmentOperator_Test *this)

{
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  initializer_list<fizplex::SVector::Nonzero> l_01;
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  ColMatrix m33;
  ColMatrix m11;
  ColMatrix *in_stack_fffffffffffffe10;
  ColMatrix *in_stack_fffffffffffffe18;
  ColMatrix *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  SVector *in_stack_fffffffffffffe40;
  undefined1 ***pppuVar2;
  iterator in_stack_fffffffffffffe48;
  undefined1 ***pppuVar3;
  ColMatrix *in_stack_fffffffffffffe50;
  initializer_list<fizplex::SVector> in_stack_fffffffffffffe58;
  AssertionResult local_198;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 *local_118;
  undefined8 local_110;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined1 **local_b8;
  undefined8 *local_b0 [3];
  undefined1 local_98 [24];
  undefined1 local_80 [24];
  undefined1 **local_68;
  undefined8 local_60;
  
  ColMatrix::ColMatrix
            (in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48,
             (size_t)in_stack_fffffffffffffe40);
  local_b8 = (undefined1 **)local_b0;
  local_d8 = 1;
  uStack_d0 = 0;
  local_e8 = 2;
  uStack_e0 = 0xc008000000000000;
  local_f8 = 0;
  uStack_f0 = 0x401c000000000000;
  local_c8 = &local_f8;
  local_c0 = 3;
  l._M_len = (size_type)in_stack_fffffffffffffe50;
  l._M_array = in_stack_fffffffffffffe48;
  SVector::SVector(in_stack_fffffffffffffe40,l);
  local_b8 = (undefined1 **)local_98;
  local_128 = 2;
  uStack_120 = 0x4010000000000000;
  local_138 = 1;
  uStack_130 = 0x4008000000000000;
  local_148 = 0;
  uStack_140 = 0x4000000000000000;
  local_118 = &local_148;
  local_110 = 3;
  l_00._M_len = (size_type)in_stack_fffffffffffffe50;
  l_00._M_array = in_stack_fffffffffffffe48;
  SVector::SVector(in_stack_fffffffffffffe40,l_00);
  local_b8 = (undefined1 **)local_80;
  local_168 = 2;
  uStack_160 = 0xc000000000000000;
  local_178 = 1;
  uStack_170 = 0xbff0000000000000;
  local_188 = 0;
  uStack_180 = 0x3ff0000000000000;
  local_158 = &local_188;
  local_150 = 3;
  l_01._M_len = (size_type)in_stack_fffffffffffffe50;
  l_01._M_array = in_stack_fffffffffffffe48;
  SVector::SVector(in_stack_fffffffffffffe40,l_01);
  local_68 = (undefined1 **)local_b0;
  local_60 = 3;
  ColMatrix::ColMatrix
            (in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48,
             (size_t)in_stack_fffffffffffffe40,in_stack_fffffffffffffe58);
  pppuVar3 = (undefined1 ***)local_b0;
  pppuVar2 = &local_68;
  do {
    pppuVar2 = pppuVar2 + -3;
    SVector::~SVector((SVector *)0x1ba94a);
  } while (pppuVar2 != pppuVar3);
  ColMatrix::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  testing::internal::EqHelper<false>::Compare<fizplex::ColMatrix,fizplex::ColMatrix>
            (in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_198);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffe60);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x1baabc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x33,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffe58,(Message *)&stack0xfffffffffffffe60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe58);
    testing::Message::~Message((Message *)0x1bab08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1bab54);
  ColMatrix::~ColMatrix((ColMatrix *)0x1bab61);
  ColMatrix::~ColMatrix((ColMatrix *)0x1bab6e);
  return;
}

Assistant:

TEST(ColMatrix, AssignmentOperator) {
  ColMatrix m11(1, 1);
  const ColMatrix m33(3, 3,
                      {{{0, 7}, {2, -3}, {1, 0.0}},
                       {{0, 2}, {1, 3}, {2, 4}},
                       {{0, 1}, {1, -1}, {2, -2}}});
  m11 = m33;
  EXPECT_EQ(m33, m11);
}